

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O0

int lj_ffh_string_char(lua_State *L)

{
  TValue *pTVar1;
  MSize sz;
  uint uVar2;
  char *str;
  GCstr *pGVar3;
  int32_t k;
  char *buf;
  int nargs;
  int i;
  lua_State *L_local;
  
  sz = (MSize)((long)L->top - (long)L->base >> 3);
  str = lj_buf_tmp(L,sz);
  buf._4_4_ = 1;
  while( true ) {
    if ((int)sz < buf._4_4_) {
      pTVar1 = L->base;
      pGVar3 = lj_str_new(L,str,(long)(int)sz);
      pTVar1[-2].u64 = (ulong)pGVar3 | 0xfffd800000000000;
      return 2;
    }
    uVar2 = lj_lib_checkint(L,buf._4_4_);
    if (uVar2 != (uVar2 & 0xff)) break;
    str[buf._4_4_ + -1] = (char)uVar2;
    buf._4_4_ = buf._4_4_ + 1;
  }
  lj_err_arg(L,buf._4_4_,LJ_ERR_BADVAL);
}

Assistant:

LJLIB_ASM(string_char)		LJLIB_REC(.)
{
  int i, nargs = (int)(L->top - L->base);
  char *buf = lj_buf_tmp(L, (MSize)nargs);
  for (i = 1; i <= nargs; i++) {
    int32_t k = lj_lib_checkint(L, i);
    if (!checku8(k))
      lj_err_arg(L, i, LJ_ERR_BADVAL);
    buf[i-1] = (char)k;
  }
  setstrV(L, L->base-1-LJ_FR2, lj_str_new(L, buf, (size_t)nargs));
  return FFH_RES(1);
}